

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O3

apx_error_t
apx_vm_deserializer_check_value_range_uint64
          (apx_vm_deserializer_t *self,uint64_t lower_limit,uint64_t upper_limit)

{
  apx_error_t aVar1;
  int32_t iVar2;
  apx_vm_readState_t *paVar3;
  int index;
  
  if (self == (apx_vm_deserializer_t *)0x0) {
    return 1;
  }
  paVar3 = self->state;
  if (paVar3->value_type == DTL_DV_ARRAY) {
    iVar2 = dtl_av_length((paVar3->value).av);
    self->state->range_check_state = '\x01';
    if (iVar2 != 0) {
      index = 0;
      do {
        aVar1 = state_store_scalar_array_value(self->state,index,'\a');
        paVar3 = self->state;
        if (aVar1 != 0) goto LAB_001298e1;
        if (paVar3->scalar_storage_type != '\x01') {
          __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/deserializer.c"
                        ,0x27e,
                        "apx_error_t apx_vm_deserializer_check_value_range_uint64(apx_vm_deserializer_t *, uint64_t, uint64_t)"
                       );
        }
        aVar1 = apx_vm_value_in_range_u64((paVar3->scalar_value).u64,lower_limit,upper_limit);
        if (aVar1 != 0) {
          paVar3 = self->state;
          goto LAB_001298e1;
        }
        index = index + 1;
      } while (iVar2 != index);
    }
LAB_001298d9:
    aVar1 = 0;
  }
  else {
    if (paVar3->value_type != DTL_DV_SCALAR) {
      return 10;
    }
    aVar1 = state_store_scalar_value(paVar3,(paVar3->value).sv,'\b');
    paVar3 = self->state;
    if (aVar1 == 0) {
      if (paVar3->scalar_storage_type != '\x03') {
        __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT64",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/deserializer.c"
                      ,0x264,
                      "apx_error_t apx_vm_deserializer_check_value_range_uint64(apx_vm_deserializer_t *, uint64_t, uint64_t)"
                     );
      }
      aVar1 = apx_vm_value_in_range_u64((paVar3->scalar_value).u64,lower_limit,upper_limit);
      paVar3 = self->state;
      if (aVar1 == 0) {
        paVar3->range_check_state = '\x01';
        goto LAB_001298d9;
      }
    }
LAB_001298e1:
    paVar3->range_check_state = '\x02';
  }
  return aVar1;
}

Assistant:

apx_error_t apx_vm_deserializer_check_value_range_uint64(apx_vm_deserializer_t* self, uint64_t lower_limit, uint64_t upper_limit)
{
   if (self != NULL)
   {
      apx_error_t retval = APX_NO_ERROR;
      if (self->state->value_type == DTL_DV_SCALAR)
      {
         retval = state_store_scalar_value(self->state, self->state->value.sv, APX_TYPE_CODE_INT64);
         if (retval == APX_NO_ERROR)
         {
            assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT64);
            retval = apx_vm_value_in_range_u64(self->state->scalar_value.u64, lower_limit, upper_limit);
            if (retval == APX_NO_ERROR)
            {
               self->state->range_check_state = APX_RANGE_CHECK_STATE_OK;
            }
            else
            {
               self->state->range_check_state = APX_RANGE_CHECK_STATE_FAIL;
            }
         }
         else
         {
            self->state->range_check_state = APX_RANGE_CHECK_STATE_FAIL;
         }
      }
      else if (self->state->value_type == DTL_DV_ARRAY)
      {
         uint32_t i;
         uint32_t length = (uint32_t)dtl_av_length(self->state->value.av);
         self->state->range_check_state = APX_RANGE_CHECK_STATE_OK;
         for (i = 0u; i < length; i++)
         {
            retval = state_store_scalar_array_value(self->state, i, APX_TYPE_CODE_INT32);
            if (retval == APX_NO_ERROR)
            {
               assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32);
               retval = apx_vm_value_in_range_u64(self->state->scalar_value.u64, lower_limit, upper_limit);
               if (retval != APX_NO_ERROR)
               {
                  self->state->range_check_state = APX_RANGE_CHECK_STATE_FAIL;
                  break;
               }
            }
            else
            {
               self->state->range_check_state = APX_RANGE_CHECK_STATE_FAIL;
               break;
            }
         }
      }
      else
      {
         retval = APX_UNSUPPORTED_ERROR;
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}